

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O0

LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> * __thiscall
data_structures::LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
deleteAfterNode(LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this,
               ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *_previous)

{
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar1;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *_current;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *_previous_local;
  LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this_local;
  
  pLVar1 = ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::next(_previous);
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::deleteAfter(_previous);
  if (pLVar1 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
    (*pLVar1->_vptr_ListNode[1])();
  }
  if (pLVar1 == this->_tail) {
    this->_tail = _previous;
  }
  this->_size = this->_size - 1;
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::deleteAfterNode(ListNode<T>* _previous){
        ListNode<T>* _current = _previous->next();
        _previous->deleteAfter();
        delete _current;
        if (_current == _tail) {
            _tail = _previous;
        }
        _size--;
        return this;
    }